

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze_live_input_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::AnalyzeLiveInputPass::DoLiveInputAnalysis(AnalyzeLiveInputPass *this)

{
  ExecutionModel EVar1;
  IRContext *pIVar2;
  LivenessManager *this_00;
  ExecutionModel stage;
  AnalyzeLiveInputPass *this_local;
  
  pIVar2 = Pass::context(&this->super_Pass);
  EVar1 = IRContext::GetStage(pIVar2);
  if ((((EVar1 == ExecutionModelFragment) || (EVar1 == ExecutionModelTessellationControl)) ||
      (EVar1 == ExecutionModelTessellationEvaluation)) || (EVar1 == ExecutionModelGeometry)) {
    pIVar2 = Pass::context(&this->super_Pass);
    this_00 = IRContext::get_liveness_mgr(pIVar2);
    analysis::LivenessManager::GetLiveness(this_00,this->live_locs_,this->live_builtins_);
    this_local._4_4_ = SuccessWithoutChange;
  }
  else {
    this_local._4_4_ = Failure;
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status AnalyzeLiveInputPass::DoLiveInputAnalysis() {
  // Current functionality only supports frag, tesc, tese or geom shaders.
  // Report failure for any other stage.
  auto stage = context()->GetStage();
  if (stage != spv::ExecutionModel::Fragment &&
      stage != spv::ExecutionModel::TessellationControl &&
      stage != spv::ExecutionModel::TessellationEvaluation &&
      stage != spv::ExecutionModel::Geometry)
    return Status::Failure;
  context()->get_liveness_mgr()->GetLiveness(live_locs_, live_builtins_);
  return Status::SuccessWithoutChange;
}